

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.hpp
# Opt level: O0

void __thiscall
Lib::Stack<std::pair<unsigned_int,_int>_>::Stack
          (Stack<std::pair<unsigned_int,_int>_> *this,Stack<std::pair<unsigned_int,_int>_> *s)

{
  pair<unsigned_int,_int> *ppVar1;
  Stack<std::pair<unsigned_int,_int>_> *in_RSI;
  Stack<std::pair<unsigned_int,_int>_> *in_RDI;
  void *mem;
  BottomFirstIterator in_stack_ffffffffffffffd8;
  
  in_RDI->_capacity = in_RSI->_capacity;
  if (in_RDI->_capacity == 0) {
    in_RDI->_stack = (pair<unsigned_int,_int> *)0x0;
  }
  else {
    ppVar1 = (pair<unsigned_int,_int> *)Lib::alloc((size_t)in_RDI);
    in_RDI->_stack = ppVar1;
  }
  in_RDI->_cursor = in_RDI->_stack;
  in_RDI->_end = in_RDI->_stack + in_RDI->_capacity;
  BottomFirstIterator::BottomFirstIterator((BottomFirstIterator *)&stack0xffffffffffffffd8,in_RSI);
  Stack<std::pair<unsigned_int,int>>::
  loadFromIterator<Lib::Stack<std::pair<unsigned_int,int>>::BottomFirstIterator>
            (in_RDI,in_stack_ffffffffffffffd8);
  return;
}

Assistant:

Stack(const Stack& s)
   : _capacity(s._capacity)
  {
    if(_capacity) {
      void* mem = ALLOC_KNOWN(_capacity*sizeof(C),className());
      _stack = static_cast<C*>(mem);
    }
    else {
      _stack = 0;
    }
    _cursor = _stack;
    _end = _stack+_capacity;

    loadFromIterator(BottomFirstIterator(const_cast<Stack&>(s)));
  }